

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

int32_t sym_GetValue(Symbol *sym)

{
  int iVar1;
  bool bVar2;
  Section *pSVar3;
  Symbol *sym_local;
  
  bVar2 = sym_IsNumeric(sym);
  if ((bVar2) && ((sym->hasCallback & 1U) != 0)) {
    sym_local._4_4_ = (*(sym->field_8).numCallback)();
  }
  else if (sym->type == SYM_LABEL) {
    iVar1 = (sym->field_8).value;
    pSVar3 = sym_GetSection(sym);
    sym_local._4_4_ = iVar1 + pSVar3->org;
  }
  else {
    sym_local._4_4_ = (sym->field_8).value;
  }
  return sym_local._4_4_;
}

Assistant:

int32_t sym_GetValue(struct Symbol const *sym)
{
	if (sym_IsNumeric(sym) && sym->hasCallback)
		return sym->numCallback();

	if (sym->type == SYM_LABEL)
		// TODO: do not use section's org directly
		return sym->value + sym_GetSection(sym)->org;

	return sym->value;
}